

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorBuilder::IsInPackage
          (DescriptorBuilder *this,FileDescriptor *file,string *package_name)

{
  void *__s1;
  ulong size;
  pointer __s2;
  size_t size_00;
  int iVar1;
  
  __s1 = (void *)**(undefined8 **)(file + 8);
  size = (*(undefined8 **)(file + 8))[1];
  if ((long)size < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig(size,"string length exceeds max size");
  }
  __s2 = (package_name->_M_dataplus)._M_p;
  size_00 = package_name->_M_string_length;
  if ((long)size_00 < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig(size_00,"string length exceeds max size");
  }
  if ((size_00 <= size) && (iVar1 = bcmp(__s1,__s2,size_00), iVar1 == 0)) {
    if ((*(long **)(file + 8))[1] == package_name->_M_string_length) {
      return true;
    }
    return *(char *)(**(long **)(file + 8) + package_name->_M_string_length) == '.';
  }
  return false;
}

Assistant:

bool DescriptorBuilder::IsInPackage(const FileDescriptor* file,
                                    const std::string& package_name) {
  return HasPrefixString(file->package(), package_name) &&
         (file->package().size() == package_name.size() ||
          file->package()[package_name.size()] == '.');
}